

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  size_type *psVar1;
  char cVar2;
  char cVar3;
  ParseError PVar4;
  int iVar5;
  istream *piVar6;
  ostream *poVar7;
  long *plVar8;
  char *pcVar9;
  string str;
  string mode;
  string code;
  Brainfuck brainfuck;
  allocator local_2d9;
  CCompiler local_2d8;
  int local_2a4;
  undefined1 *local_2a0 [2];
  undefined1 local_290 [16];
  string local_280;
  char **local_260;
  string local_258;
  Brainfuck local_238 [5];
  
  if (argc < 2) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"usage: BrainfuckInterpreter file.bf [i/c]",0x29);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x48);
    std::ostream::put(-0x48);
    std::ostream::flush();
    return -1;
  }
  local_258._M_dataplus._M_p = (pointer)&local_258.field_2;
  local_258._M_string_length = 0;
  local_258.field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::string((string *)&local_280,argv[1],&local_2d9);
  std::ifstream::ifstream(local_238,(string *)&local_280,_S_in);
  cVar2 = std::__basic_file<char>::is_open();
  if (cVar2 != '\0') {
    local_2d8.super_Compiler._vptr_Compiler = (_func_int **)&local_2d8._code._M_string_length;
    local_2d8._code._M_dataplus._M_p = (pointer)0x0;
    local_2d8._code._M_string_length._0_1_ = 0;
    local_2a4 = argc;
    local_260 = argv;
    while( true ) {
      cVar3 = std::ios::widen((char)*(undefined8 *)
                                     &local_238[0]._commands.
                                      super__Vector_base<Brainfuck::CommandNode,_std::allocator<Brainfuck::CommandNode>_>
                                      ._M_impl.super__Vector_impl_data._M_start[-2].command +
                              (char)local_238);
      piVar6 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                         ((istream *)local_238,(string *)&local_2d8,cVar3);
      if (((byte)piVar6[*(long *)(*(long *)piVar6 + -0x18) + 0x20] & 5) != 0) break;
      local_2a0[0] = local_290;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_2a0,local_2d8.super_Compiler._vptr_Compiler,
                 local_2d8._code._M_dataplus._M_p + (long)local_2d8.super_Compiler._vptr_Compiler);
      std::__cxx11::string::append((char *)local_2a0);
      std::__cxx11::string::_M_append((char *)&local_258,(ulong)local_2a0[0]);
      if (local_2a0[0] != local_290) {
        operator_delete(local_2a0[0]);
      }
    }
    std::ifstream::close();
    argv = local_260;
    argc = local_2a4;
    if (local_2d8.super_Compiler._vptr_Compiler != (_func_int **)&local_2d8._code._M_string_length)
    {
      operator_delete(local_2d8.super_Compiler._vptr_Compiler);
    }
  }
  std::ifstream::~ifstream(local_238);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_280._M_dataplus._M_p != &local_280.field_2) {
    operator_delete(local_280._M_dataplus._M_p);
  }
  if (cVar2 == '\0') {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"failed to read input file!",0x1a);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x48);
    std::ostream::put(-0x48);
    iVar5 = -1;
    std::ostream::flush();
    goto LAB_00103852;
  }
  Brainfuck::Brainfuck(local_238);
  PVar4 = Brainfuck::Parse(local_238,&local_258);
  if (PVar4 == Success) {
    if (argc == 2) {
      pcVar9 = "i";
    }
    else {
      pcVar9 = argv[2];
    }
    std::__cxx11::string::string((string *)local_2a0,pcVar9,(allocator *)&local_2d8);
    iVar5 = std::__cxx11::string::compare((char *)local_2a0);
    if (iVar5 == 0) {
      StdIoInterpreter::StdIoInterpreter((StdIoInterpreter *)&local_2d8,30000);
      Brainfuck::Execute(local_238,(Interpreter *)&local_2d8);
      local_2d8.super_Compiler._vptr_Compiler = (_func_int **)&PTR_IncrementPointer_00108ce0;
      if (local_2d8._code._M_dataplus._M_p != (pointer)0x0) {
LAB_0010381a:
        operator_delete(local_2d8._code._M_dataplus._M_p);
      }
LAB_0010381f:
      iVar5 = 0;
    }
    else {
      iVar5 = std::__cxx11::string::compare((char *)local_2a0);
      if (iVar5 == 0) {
        CCompiler::CCompiler(&local_2d8);
        Brainfuck::Compile(local_238,&local_2d8.super_Compiler);
        CCompiler::GetCode_abi_cxx11_(&local_280,&local_2d8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,local_280._M_dataplus._M_p,local_280._M_string_length);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_280._M_dataplus._M_p != &local_280.field_2) {
          operator_delete(local_280._M_dataplus._M_p);
        }
        local_2d8.super_Compiler._vptr_Compiler = (_func_int **)&PTR_IncrementPointer_00108d50;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2d8._code._M_dataplus._M_p != &local_2d8._code.field_2) goto LAB_0010381a;
        goto LAB_0010381f;
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Unknown mode!",0xd);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x48);
      std::ostream::put(-0x48);
      iVar5 = -1;
      std::ostream::flush();
    }
    if (local_2a0[0] != local_290) {
      operator_delete(local_2a0[0]);
    }
  }
  else {
    psVar1 = &local_2d8._code._M_string_length;
    local_2d8._code._M_dataplus._M_p = (pointer)0x0;
    local_2d8._code._M_string_length._0_1_ = 0;
    if (PVar4 == ErrorBracketMismatch) {
      pcVar9 = "ErrorBracketMismatch";
    }
    else if (PVar4 == GenericError) {
      pcVar9 = "GenericError";
    }
    else {
      pcVar9 = "UNKNOWN";
    }
    local_2d8.super_Compiler._vptr_Compiler = (_func_int **)psVar1;
    std::__cxx11::string::_M_replace((ulong)&local_2d8,0,(char *)0x0,(ulong)pcVar9);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"There was an error parsing (",0x1c);
    poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,(char *)local_2d8.super_Compiler._vptr_Compiler,
                        (long)local_2d8._code._M_dataplus._M_p);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,") on line ",10);
    poVar7 = (ostream *)std::ostream::operator<<(poVar7,local_238[0]._line);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7," column ",8);
    plVar8 = (long *)std::ostream::operator<<(poVar7,local_238[0]._column);
    std::ios::widen((char)*(undefined8 *)(*plVar8 + -0x18) + (char)plVar8);
    std::ostream::put((char)plVar8);
    std::ostream::flush();
    if (local_2d8.super_Compiler._vptr_Compiler != (_func_int **)psVar1) {
      operator_delete(local_2d8.super_Compiler._vptr_Compiler);
    }
    iVar5 = -1;
  }
  std::
  _Hashtable<char,_std::pair<const_char,_Brainfuck::Command>,_std::allocator<std::pair<const_char,_Brainfuck::Command>_>,_std::__detail::_Select1st,_std::equal_to<char>,_std::hash<char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&local_238[0]._commandMap._M_h);
  if (local_238[0]._commands.
      super__Vector_base<Brainfuck::CommandNode,_std::allocator<Brainfuck::CommandNode>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_238[0]._commands.
                    super__Vector_base<Brainfuck::CommandNode,_std::allocator<Brainfuck::CommandNode>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
LAB_00103852:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_258._M_dataplus._M_p != &local_258.field_2) {
    operator_delete(local_258._M_dataplus._M_p);
  }
  return iVar5;
}

Assistant:

int main(int argc, char* argv[])
{
    if(argc < 2)
    {
        std::cout << "usage: BrainfuckInterpreter file.bf [i/c]" << std::endl;
        return -1;
    }

    std::string code;
    if(!readFile(argv[1], code))
    {
        std::cout << "failed to read input file!" << std::endl;
        return -1;
    }

    auto brainfuck = Brainfuck();
    auto error = brainfuck.Parse(code);
    if (error != Brainfuck::Success)
    {
        std::string errorName;
        switch (error)
        {
            case Brainfuck::ErrorBracketMismatch:
                errorName = "ErrorBracketMismatch";
                break;

            case Brainfuck::GenericError:
                errorName = "GenericError";
                break;

            default:
                errorName = "UNKNOWN";
                break;
        }
        int line, column;
        brainfuck.GetLocation(line, column);
        std::cout << "There was an error parsing (" << errorName << ") on line " << line << " column " << column << std::endl;
        return -1;
    }

    auto mode = std::string(argc > 2 ? argv[2] : "i");
    if(mode == "i") //interpret the file
    {
        auto semantics = StdIoInterpreter();
        brainfuck.Execute(semantics);
    }
    else if(mode == "c") //compile to c
    {
        auto compiler = CCompiler();
        brainfuck.Compile(compiler);
        std::cout << compiler.GetCode();
    }
    else
    {
        std::cout << "Unknown mode!" << std::endl;
        return -1;
    }
    return 0;
}